

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O0

int tcc_output_file(TCCState *s,char *filename)

{
  int iVar1;
  int ret;
  char *filename_local;
  TCCState *s_local;
  
  iVar1 = elf_output_file(s,filename);
  return iVar1;
}

Assistant:

LIBTCCAPI int tcc_output_file(TCCState* s, const char* filename) {
  int ret;
#ifdef TCC_TARGET_PE
  if (s->output_type != TCC_OUTPUT_OBJ) {
    ret = pe_output_file(s, filename);
  } else
#endif
    ret = elf_output_file(s, filename);
  return ret;
}